

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O0

void tsgEstimateAnisotropicCoefficientsStatic(void *grid,char *sType,int output,int *coefficients)

{
  TypeDepth TVar1;
  ostream *poVar2;
  reference pvVar3;
  int local_84;
  undefined1 local_80 [4];
  int i;
  vector<int,_std::allocator<int>_> coeff;
  int num_coefficients;
  allocator<char> local_51;
  string local_50;
  TypeDepth local_2c;
  int *piStack_28;
  TypeDepth depth_type;
  int *coefficients_local;
  char *pcStack_18;
  int output_local;
  char *sType_local;
  void *grid_local;
  
  piStack_28 = coefficients;
  coefficients_local._4_4_ = output;
  pcStack_18 = sType;
  sType_local = (char *)grid;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,sType,&local_51);
  TVar1 = TasGrid::IO::getDepthTypeString(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_2c = TVar1;
  if (TVar1 == type_none) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect depth type: ");
    poVar2 = std::operator<<(poVar2,pcStack_18);
    poVar2 = std::operator<<(poVar2,", defaulting to type_iptotal.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (local_2c == type_none) {
    local_2c = type_iptotal;
  }
  coeff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ =
       TasGrid::TasmanianSparseGrid::getNumDimensions((TasmanianSparseGrid *)sType_local);
  if (((local_2c == type_curved) || (local_2c == type_ipcurved)) || (local_2c == type_qpcurved)) {
    coeff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)coeff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage << 1;
  }
  TasGrid::TasmanianSparseGrid::estimateAnisotropicCoefficients
            ((vector<int,_std::allocator<int>_> *)local_80,(TasmanianSparseGrid *)sType_local,
             local_2c,coefficients_local._4_4_);
  for (local_84 = 0;
      local_84 <
      (int)coeff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage; local_84 = local_84 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,(long)local_84);
    piStack_28[local_84] = *pvVar3;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  return;
}

Assistant:

void tsgEstimateAnisotropicCoefficientsStatic(void *grid, const char * sType, int output, int *coefficients){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    #endif // NDEBUG
    if (depth_type == type_none){ depth_type = type_iptotal; }
    int num_coefficients = ((TasmanianSparseGrid*) grid)->getNumDimensions();
    if ((depth_type == type_curved) || (depth_type == type_ipcurved) || (depth_type == type_qpcurved)){
        num_coefficients *= 2;
    }
    auto coeff = ((TasmanianSparseGrid*) grid)->estimateAnisotropicCoefficients(depth_type, output);
    for(int i=0; i<num_coefficients; i++) coefficients[i] = coeff[i];
}